

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad.c
# Opt level: O3

uint aom_highbd_sad4x4_c(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  ulong *puVar10;
  ulong *puVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar17;
  uint uVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  puVar10 = (ulong *)((long)ref * 2);
  puVar11 = (ulong *)((long)src * 2);
  uVar14 = 0;
  iVar12 = 4;
  do {
    uVar1 = *puVar11;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2._12_2_ = (short)(uVar1 >> 0x30);
    auVar4._8_2_ = (short)(uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._10_4_ = auVar2._10_4_;
    auVar8._6_8_ = 0;
    auVar8._0_6_ = auVar4._8_6_;
    auVar6._4_2_ = (short)(uVar1 >> 0x10);
    auVar6._0_4_ = (uint)uVar1;
    auVar6._6_8_ = SUB148(auVar8 << 0x40,6);
    auVar15._0_4_ = (uint)uVar1 & 0xffff;
    auVar15._4_10_ = auVar6._4_10_;
    auVar15._14_2_ = 0;
    uVar1 = *puVar10;
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3._12_2_ = (short)(uVar1 >> 0x30);
    auVar5._8_2_ = (short)(uVar1 >> 0x20);
    auVar5._0_8_ = uVar1;
    auVar5._10_4_ = auVar3._10_4_;
    auVar9._6_8_ = 0;
    auVar9._0_6_ = auVar5._8_6_;
    auVar7._4_2_ = (short)(uVar1 >> 0x10);
    auVar7._0_4_ = (uint)uVar1;
    auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
    auVar20._0_4_ = (uint)uVar1 & 0xffff;
    auVar20._4_10_ = auVar7._4_10_;
    auVar20._14_2_ = 0;
    auVar21 = auVar20 | _DAT_004c81d0;
    auVar16 = auVar15 | _DAT_004c81d0;
    uVar13 = -(uint)(auVar21._0_4_ < auVar16._0_4_);
    uVar17 = -(uint)(auVar21._4_4_ < auVar16._4_4_);
    uVar18 = -(uint)(auVar21._8_4_ < auVar16._8_4_);
    uVar19 = -(uint)(auVar21._12_4_ < auVar16._12_4_);
    uVar14 = (uVar19 - ((auVar2._10_4_ >> 0x10) - (auVar3._10_4_ >> 0x10) ^ uVar19)) +
             (uVar17 - (auVar6._4_4_ - auVar7._4_4_ ^ uVar17)) +
             (uVar18 - (auVar4._8_4_ - auVar5._8_4_ ^ uVar18)) +
             (uVar13 - (auVar15._0_4_ - auVar20._0_4_ ^ uVar13)) + uVar14;
    puVar10 = (ulong *)((long)puVar10 + (long)ref_stride * 2);
    puVar11 = (ulong *)((long)puVar11 + (long)src_stride * 2);
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  return uVar14;
}

Assistant:

static inline unsigned int highbd_sad(const uint8_t *a8, int a_stride,
                                      const uint8_t *b8, int b_stride,
                                      int width, int height) {
  int y, x;
  unsigned int sad = 0;
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      sad += abs(a[x] - b[x]);
    }

    a += a_stride;
    b += b_stride;
  }
  return sad;
}